

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

Symbol * __thiscall slang::ast::Scope::find(Scope *this,string_view name)

{
  char *pcVar1;
  SymbolKind SVar2;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_00;
  long lVar3;
  uint uVar4;
  size_t __n;
  char *__s1;
  int iVar5;
  uint64_t uVar6;
  SubroutineSymbol *pSVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  Scope *pSVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  local_58._M_str = name._M_str;
  local_58._M_len = name._M_len;
  if (this->deferredMemberIndex != Invalid) {
    elaborate(this);
  }
  this_00 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this->nameMap;
  uVar6 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                    (this_00,&local_58);
  __s1 = local_58._M_str;
  __n = local_58._M_len;
  uVar9 = uVar6 >> ((byte)*this_00 & 0x3f);
  lVar3 = *(long *)(this_00 + 0x10);
  lVar10 = (uVar6 & 0xff) * 4;
  cVar16 = (&UNK_0051605c)[lVar10];
  cVar17 = (&UNK_0051605d)[lVar10];
  cVar18 = (&UNK_0051605e)[lVar10];
  cVar19 = (&UNK_0051605f)[lVar10];
  uVar11 = 0;
  cVar20 = cVar16;
  cVar21 = cVar17;
  cVar22 = cVar18;
  cVar23 = cVar19;
  cVar24 = cVar16;
  cVar25 = cVar17;
  cVar26 = cVar18;
  cVar27 = cVar19;
  cVar28 = cVar16;
  cVar29 = cVar17;
  cVar30 = cVar18;
  cVar31 = cVar19;
  do {
    pcVar1 = (char *)(lVar3 + uVar9 * 0x10);
    auVar15[0] = -(*pcVar1 == cVar16);
    auVar15[1] = -(pcVar1[1] == cVar17);
    auVar15[2] = -(pcVar1[2] == cVar18);
    auVar15[3] = -(pcVar1[3] == cVar19);
    auVar15[4] = -(pcVar1[4] == cVar20);
    auVar15[5] = -(pcVar1[5] == cVar21);
    auVar15[6] = -(pcVar1[6] == cVar22);
    auVar15[7] = -(pcVar1[7] == cVar23);
    auVar15[8] = -(pcVar1[8] == cVar24);
    auVar15[9] = -(pcVar1[9] == cVar25);
    auVar15[10] = -(pcVar1[10] == cVar26);
    auVar15[0xb] = -(pcVar1[0xb] == cVar27);
    auVar15[0xc] = -(pcVar1[0xc] == cVar28);
    auVar15[0xd] = -(pcVar1[0xd] == cVar29);
    auVar15[0xe] = -(pcVar1[0xe] == cVar30);
    auVar15[0xf] = -(pcVar1[0xf] == cVar31);
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe);
    if (uVar8 != 0) {
      lVar10 = *(long *)(this_00 + 0x18) + uVar9 * 0x168;
      local_48 = cVar16;
      cStack_47 = cVar17;
      cStack_46 = cVar18;
      cStack_45 = cVar19;
      cStack_44 = cVar20;
      cStack_43 = cVar21;
      cStack_42 = cVar22;
      cStack_41 = cVar23;
      cStack_40 = cVar24;
      cStack_3f = cVar25;
      cStack_3e = cVar26;
      cStack_3d = cVar27;
      cStack_3c = cVar28;
      cStack_3b = cVar29;
      cStack_3a = cVar30;
      cStack_39 = cVar31;
      do {
        uVar4 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        bVar14 = __n == *(size_t *)(lVar10 + (ulong)uVar4 * 0x18);
        lVar12 = lVar10 + (ulong)uVar4 * 0x18;
        if (bVar14 && __n != 0) {
          iVar5 = bcmp(__s1,*(void **)(lVar12 + 8),__n);
          bVar14 = iVar5 == 0;
          cVar16 = local_48;
          cVar17 = cStack_47;
          cVar18 = cStack_46;
          cVar19 = cStack_45;
          cVar20 = cStack_44;
          cVar21 = cStack_43;
          cVar22 = cStack_42;
          cVar23 = cStack_41;
          cVar24 = cStack_40;
          cVar25 = cStack_3f;
          cVar26 = cStack_3e;
          cVar27 = cStack_3d;
          cVar28 = cStack_3c;
          cVar29 = cStack_3b;
          cVar30 = cStack_3a;
          cVar31 = cStack_39;
        }
        if (bVar14) goto LAB_0014e376;
        uVar8 = uVar8 - 1 & uVar8;
      } while (uVar8 != 0);
    }
    if ((*(byte *)(uVar9 * 0x10 + lVar3 + 0xf) &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar6 & 7]) == 0) break;
    lVar10 = uVar9 + uVar11;
    uVar11 = uVar11 + 1;
    uVar9 = lVar10 + 1U & *(ulong *)(this_00 + 8);
  } while (uVar11 <= *(ulong *)(this_00 + 8));
  lVar12 = 0;
LAB_0014e376:
  if (lVar12 != 0) {
    pSVar13 = (Scope *)(lVar12 + 0x10);
    while( true ) {
      pSVar7 = (SubroutineSymbol *)pSVar13->compilation;
      SVar2 = (pSVar7->super_Symbol).kind;
      if (SVar2 != TransparentMember) break;
      pSVar13 = &pSVar7->super_Scope;
    }
    if (SVar2 != ForwardingTypedef) {
      if (SVar2 == ModportClocking) {
        return &((SubroutineSymbol *)(pSVar7->super_Scope).compilation)->super_Symbol;
      }
      if (SVar2 != ExplicitImport) {
        if (SVar2 != MethodPrototype) {
          return &pSVar7->super_Symbol;
        }
        pSVar7 = MethodPrototypeSymbol::getSubroutine((MethodPrototypeSymbol *)pSVar7);
        return &pSVar7->super_Symbol;
      }
    }
  }
  return &((SubroutineSymbol *)0x0)->super_Symbol;
}

Assistant:

const Symbol* Scope::find(std::string_view name) const {
    // Just do a simple lookup and return the result if we have one.
    ensureElaborated();
    auto it = nameMap->find(name);
    if (it == nameMap->end())
        return nullptr;

    // Unwrap the symbol if it's a transparent member. Don't return imported
    // symbols; this function is for querying direct members only.
    const Symbol* symbol = it->second;
    while (symbol->kind == SymbolKind::TransparentMember)
        symbol = &symbol->as<TransparentMemberSymbol>().wrapped;

    switch (symbol->kind) {
        case SymbolKind::ExplicitImport:
        case SymbolKind::ForwardingTypedef:
            return nullptr;
        case SymbolKind::MethodPrototype:
            return symbol->as<MethodPrototypeSymbol>().getSubroutine();
        case SymbolKind::ModportClocking:
            return symbol->as<ModportClockingSymbol>().target;
        default:
            return symbol;
    }
}